

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
stream<asio::io_context&>
          (stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>> *this,
          io_context *arg,context *ctx)

{
  native_handle_type context;
  lowest_layer_type *this_00;
  executor_type local_60;
  context *local_20;
  context *ctx_local;
  io_context *arg_local;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this_local;
  
  local_20 = ctx;
  ctx_local = (context *)arg;
  arg_local = (io_context *)this;
  asio::detail::noncopyable::noncopyable((noncopyable *)this);
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)this,
             (io_context *)ctx_local,0);
  context = ssl::context::native_handle(local_20);
  this_00 = basic_socket<asio::ip::tcp,_asio::any_io_executor>::lowest_layer
                      ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)this);
  basic_socket<asio::ip::tcp,_asio::any_io_executor>::get_executor(&local_60,this_00);
  detail::stream_core::stream_core<asio::any_io_executor>
            ((stream_core *)(this + 0x50),context,&local_60);
  any_io_executor::~any_io_executor(&local_60);
  return;
}

Assistant:

stream(Arg&& arg, context& ctx)
    : next_layer_(ASIO_MOVE_CAST(Arg)(arg)),
      core_(ctx.native_handle(), next_layer_.lowest_layer().get_executor())
  {
  }